

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.h
# Opt level: O2

void llvm::format_provider<llvm::dwarf::Attribute,_void>::format
               (Attribute *E,raw_ostream *OS,StringRef Style)

{
  raw_ostream *prVar1;
  StringRef Str;
  format_object_base local_30;
  Attribute local_20;
  
  Str = dwarf::AttributeString((uint)*E);
  if (Str.Length != 0) {
    raw_ostream::operator<<(OS,Str);
    return;
  }
  prVar1 = raw_ostream::operator<<(OS,"DW_");
  prVar1 = raw_ostream::operator<<(prVar1,"AT");
  prVar1 = raw_ostream::operator<<(prVar1,"_unknown_");
  local_30.Fmt = "%x";
  local_30._vptr_format_object_base = (_func_int **)&PTR_home_01127b70;
  local_20 = *E;
  raw_ostream::operator<<(prVar1,&local_30);
  return;
}

Assistant:

static void format(const Enum &E, raw_ostream &OS, StringRef Style) {
    StringRef Str = dwarf::EnumTraits<Enum>::StringFn(E);
    if (Str.empty()) {
      OS << "DW_" << dwarf::EnumTraits<Enum>::Type << "_unknown_"
         << llvm::format("%x", E);
    } else
      OS << Str;
  }